

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr * __thiscall c4::yml::Tree::val_ref(Tree *this,size_t node)

{
  Location loc;
  error_flags eVar1;
  NodeData *pNVar2;
  size_t in_RSI;
  undefined8 in_RDI;
  bool bVar3;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Location *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffffa8;
  Tree *in_stack_ffffffffffffffb0;
  undefined8 uVar4;
  size_t in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  size_t sVar5;
  
  uVar4 = in_RDI;
  sVar5 = in_RSI;
  pNVar2 = _p(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (((pNVar2->m_type).type & VALREF) != NOTYPE) {
    in_stack_ffffffffffffffd0 = in_RSI;
    pNVar2 = _p(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bVar3 = false;
    if (((pNVar2->m_type).type & VALANCH) != NOTYPE) {
      bVar3 = ((pNVar2->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
    }
    in_stack_ffffffffffffffd8 = in_RDI;
    if (!bVar3) goto LAB_003d6f60;
  }
  eVar1 = get_error_flags();
  if (((eVar1 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
    trap_instruction();
  }
  Location::Location(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
  loc.super_LineCol.line = uVar4;
  loc.super_LineCol.offset = in_RSI;
  loc.super_LineCol.col = in_stack_ffffffffffffffd0;
  loc.name.str = (char *)in_stack_ffffffffffffffd8;
  loc.name.len = sVar5;
  error<57ul>((char (*) [57])in_stack_ffffffffffffffb0,loc);
LAB_003d6f60:
  pNVar2 = _p(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return &(pNVar2->m_val).anchor;
}

Assistant:

csubstr    const& val_ref   (size_t node) const { RYML_ASSERT(is_val_ref(node) && ! has_val_anchor(node)); return _p(node)->m_val.anchor; }